

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::CompactData::CompactDataSink::put
          (CompactDataSink *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *status)

{
  CompactData *pCVar1;
  UBool UVar2;
  int32_t iVar3;
  int iVar4;
  size_t sVar5;
  undefined4 extraout_var;
  UChar *pUStack_a0;
  int32_t numZeros;
  UChar *patternString;
  Form local_90;
  int32_t patternLength;
  Form plural;
  int i4;
  ResourceTable pluralVariantsTable;
  undefined1 local_58 [2];
  int8_t multiplier;
  int8_t magnitude;
  int i3;
  ResourceTable powersOfTenTable;
  UErrorCode *status_local;
  UBool param_3_local;
  ResourceValue *value_local;
  char *key_local;
  CompactDataSink *this_local;
  
  powersOfTenTable._32_8_ = status;
  value_local = (ResourceValue *)key;
  key_local = (char *)this;
  (*(value->super_UObject)._vptr_UObject[0xb])(local_58,value,status);
  UVar2 = ::U_FAILURE(*(UErrorCode *)powersOfTenTable._32_8_);
  if (UVar2 == '\0') {
    pluralVariantsTable._36_4_ = 0;
    while (UVar2 = ResourceTable::getKeyAndValue
                             ((ResourceTable *)local_58,pluralVariantsTable._36_4_,
                              (char **)&value_local,value), UVar2 != '\0') {
      sVar5 = strlen((char *)value_local);
      pluralVariantsTable.length._3_1_ = (char)sVar5 + -1;
      pluralVariantsTable.length._2_1_ = this->data->multipliers[pluralVariantsTable.length._3_1_];
      (*(value->super_UObject)._vptr_UObject[0xb])(&plural,value,powersOfTenTable._32_8_);
      UVar2 = ::U_FAILURE(*(UErrorCode *)powersOfTenTable._32_8_);
      if (UVar2 != '\0') {
        return;
      }
      patternLength = 0;
      while (UVar2 = ResourceTable::getKeyAndValue
                               ((ResourceTable *)&plural,patternLength,(char **)&value_local,value),
            UVar2 != '\0') {
        local_90 = StandardPlural::fromString
                             ((char *)value_local,(UErrorCode *)powersOfTenTable._32_8_);
        UVar2 = ::U_FAILURE(*(UErrorCode *)powersOfTenTable._32_8_);
        if (UVar2 != '\0') {
          return;
        }
        pCVar1 = this->data;
        iVar3 = anon_unknown.dwarf_19dcfe::getIndex((int)pluralVariantsTable.length._3_1_,local_90);
        if (pCVar1->patterns[iVar3] == (UChar *)0x0) {
          iVar4 = (*(value->super_UObject)._vptr_UObject[4])
                            (value,(long)&patternString + 4,powersOfTenTable._32_8_);
          pUStack_a0 = (UChar *)CONCAT44(extraout_var,iVar4);
          UVar2 = ::U_FAILURE(*(UErrorCode *)powersOfTenTable._32_8_);
          if (UVar2 != '\0') {
            return;
          }
          iVar3 = u_strcmp_63(pUStack_a0,L"0");
          if (iVar3 == 0) {
            pUStack_a0 = (UChar *)::(anonymous_namespace)::USE_FALLBACK;
            patternString._4_4_ = 0;
          }
          pCVar1 = this->data;
          iVar3 = anon_unknown.dwarf_19dcfe::getIndex
                            ((int)pluralVariantsTable.length._3_1_,local_90);
          pCVar1->patterns[iVar3] = pUStack_a0;
          if ((pluralVariantsTable.length._2_1_ == '\0') &&
             (iVar3 = anon_unknown.dwarf_19dcfe::countZeros(pUStack_a0,patternString._4_4_),
             0 < iVar3)) {
            pluralVariantsTable.length._2_1_ = ((char)iVar3 - pluralVariantsTable.length._3_1_) + -1
            ;
          }
        }
        patternLength = patternLength + 1;
      }
      if (this->data->multipliers[pluralVariantsTable.length._3_1_] == '\0') {
        this->data->multipliers[pluralVariantsTable.length._3_1_] = pluralVariantsTable.length._2_1_
        ;
        if (this->data->largestMagnitude < pluralVariantsTable.length._3_1_) {
          this->data->largestMagnitude = pluralVariantsTable.length._3_1_;
        }
        this->data->isEmpty = '\0';
      }
      pluralVariantsTable._36_4_ = pluralVariantsTable._36_4_ + 1;
    }
  }
  return;
}

Assistant:

void CompactData::CompactDataSink::put(const char *key, ResourceValue &value, UBool /*noFallback*/,
                                       UErrorCode &status) {
    // traverse into the table of powers of ten
    ResourceTable powersOfTenTable = value.getTable(status);
    if (U_FAILURE(status)) { return; }
    for (int i3 = 0; powersOfTenTable.getKeyAndValue(i3, key, value); ++i3) {

        // Assumes that the keys are always of the form "10000" where the magnitude is the
        // length of the key minus one.  We expect magnitudes to be less than MAX_DIGITS.
        auto magnitude = static_cast<int8_t> (strlen(key) - 1);
        int8_t multiplier = data.multipliers[magnitude];
        U_ASSERT(magnitude < COMPACT_MAX_DIGITS);

        // Iterate over the plural variants ("one", "other", etc)
        ResourceTable pluralVariantsTable = value.getTable(status);
        if (U_FAILURE(status)) { return; }
        for (int i4 = 0; pluralVariantsTable.getKeyAndValue(i4, key, value); ++i4) {

            // Skip this magnitude/plural if we already have it from a child locale.
            // Note: This also skips USE_FALLBACK entries.
            StandardPlural::Form plural = StandardPlural::fromString(key, status);
            if (U_FAILURE(status)) { return; }
            if (data.patterns[getIndex(magnitude, plural)] != nullptr) {
                continue;
            }

            // The value "0" means that we need to use the default pattern and not fall back
            // to parent locales. Example locale where this is relevant: 'it'.
            int32_t patternLength;
            const UChar *patternString = value.getString(patternLength, status);
            if (U_FAILURE(status)) { return; }
            if (u_strcmp(patternString, u"0") == 0) {
                patternString = USE_FALLBACK;
                patternLength = 0;
            }

            // Save the pattern string. We will parse it lazily.
            data.patterns[getIndex(magnitude, plural)] = patternString;

            // If necessary, compute the multiplier: the difference between the magnitude
            // and the number of zeros in the pattern.
            if (multiplier == 0) {
                int32_t numZeros = countZeros(patternString, patternLength);
                if (numZeros > 0) { // numZeros==0 in certain cases, like Somali "Kun"
                    multiplier = static_cast<int8_t> (numZeros - magnitude - 1);
                }
            }
        }

        // Save the multiplier.
        if (data.multipliers[magnitude] == 0) {
            data.multipliers[magnitude] = multiplier;
            if (magnitude > data.largestMagnitude) {
                data.largestMagnitude = magnitude;
            }
            data.isEmpty = false;
        } else {
            U_ASSERT(data.multipliers[magnitude] == multiplier);
        }
    }
}